

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::Temp::~Temp(Temp *this)

{
  Temp *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  clear(in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

CLUFactor<R>::Temp::~Temp()
{
   clear();
}